

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

char * nifti_findhdrname(char *fname)

{
  int iVar1;
  int iVar2;
  char *__s;
  char *pcVar3;
  size_t sVar4;
  size_t maxlen;
  long lVar5;
  char extzip [4];
  char elist [2] [5];
  
  builtin_strncpy(elist[0],".hdr",5);
  builtin_strncpy(elist[1],".nii",5);
  builtin_strncpy(extzip,".gz",4);
  iVar1 = nifti_validfilename(fname);
  if ((iVar1 == 0) || (__s = nifti_makebasename(fname), __s == (char *)0x0)) {
LAB_001090a8:
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = nifti_find_file_extension(fname);
    if (pcVar3 == (char *)0x0) {
      lVar5 = 1;
LAB_00108fbc:
      sVar4 = strlen(__s);
      pcVar3 = (char *)calloc(1,sVar4 + 8);
      if (pcVar3 == (char *)0x0) {
        fwrite("** nifti_findhdrname: failed to alloc hdrname\n",0x2e,1,_stderr);
        pcVar3 = __s;
LAB_001090a3:
        free(pcVar3);
        goto LAB_001090a8;
      }
      strcpy(pcVar3,__s);
      strcat(pcVar3,elist[lVar5]);
      iVar1 = nifti_fileexists(pcVar3);
      if (iVar1 == 0) {
        strcat(pcVar3,extzip);
        iVar1 = nifti_fileexists(pcVar3);
        if (iVar1 == 0) {
          strcpy(pcVar3,__s);
          strcat(pcVar3,elist[(uint)lVar5 ^ 1]);
          iVar1 = nifti_fileexists(pcVar3);
          if (iVar1 == 0) {
            strcat(pcVar3,extzip);
            iVar1 = nifti_fileexists(pcVar3);
            free(__s);
            if (iVar1 != 0) {
              return pcVar3;
            }
            goto LAB_001090a3;
          }
        }
      }
    }
    else {
      iVar1 = is_uppercase(pcVar3);
      iVar2 = nifti_fileexists(fname);
      if (iVar2 == 0) {
        lVar5 = 1;
LAB_00108f9a:
        if (iVar1 != 0) {
          make_uppercase(elist[0]);
          make_uppercase(elist[1]);
          make_uppercase(extzip);
        }
        goto LAB_00108fbc;
      }
      iVar2 = fileext_n_compare(pcVar3,".img",maxlen);
      if (iVar2 == 0) {
        lVar5 = 0;
        goto LAB_00108f9a;
      }
      pcVar3 = nifti_strdup(fname);
    }
    free(__s);
  }
  return pcVar3;
}

Assistant:

char * nifti_findhdrname(const char* fname)
{
   char *basename, *hdrname;
   const char *ext;
   char  elist[2][5] = { ".hdr", ".nii" };
   char  extzip[4]   = ".gz";
   int   efirst = 1;    /* init to .nii extension */
   int   eisupper = 0;  /* init to lowercase extensions */

   /**- check input file(s) for sanity */
   if( !nifti_validfilename(fname) ) return NULL;

   basename = nifti_makebasename(fname);
   if( !basename ) return NULL;   /* only on string alloc failure */

   /**- return filename if it has a valid extension and exists
         (except if it is an .img file (and maybe .gz)) */
   ext = nifti_find_file_extension(fname);

   if( ext ) eisupper = is_uppercase(ext);  /* do we look for uppercase? */

   /* if the file exists and is a valid header name (not .img), return it */
   if ( ext && nifti_fileexists(fname) ) {
     /* allow for uppercase extension */
     if ( fileext_n_compare(ext,".img",4) != 0 ){
        hdrname = nifti_strdup(fname);
        free(basename);
        return hdrname;
     } else
        efirst = 0;     /* note for below */
   }

   /* So the requested name is a basename, contains .img, or does not exist. */
   /* In any case, use basename. */

   /**- if .img, look for .hdr, .hdr.gz, .nii, .nii.gz, in that order */
   /**- else,    look for .nii, .nii.gz, .hdr, .hdr.gz, in that order */

   /* if we get more extension choices, this could be a loop */

   /* note: efirst is 0 in the case of ".img" */

   /* if the user passed an uppercase entension (.IMG), search for uppercase */
   if( eisupper ) {
      make_uppercase(elist[0]);
      make_uppercase(elist[1]);
      make_uppercase(extzip);
   }

   hdrname = (char *)calloc(sizeof(char),strlen(basename)+8);
   if( !hdrname ){
      fprintf(stderr,"** nifti_findhdrname: failed to alloc hdrname\n");
      free(basename);
      return NULL;
   }

   strcpy(hdrname,basename);
   strcat(hdrname,elist[efirst]);
   if (nifti_fileexists(hdrname)) { free(basename); return hdrname; }
#ifdef HAVE_ZLIB
   strcat(hdrname,extzip);
   if (nifti_fileexists(hdrname)) { free(basename); return hdrname; }
#endif

   /* okay, try the other possibility */

   efirst = 1 - efirst;

   strcpy(hdrname,basename);
   strcat(hdrname,elist[efirst]);
   if (nifti_fileexists(hdrname)) { free(basename); return hdrname; }
#ifdef HAVE_ZLIB
   strcat(hdrname,extzip);
   if (nifti_fileexists(hdrname)) { free(basename); return hdrname; }
#endif

   /**- if nothing has been found, return NULL */
   free(basename);
   free(hdrname);
   return NULL;
}